

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpConnection.cpp
# Opt level: O2

void __thiscall
higan::TcpConnection::TcpConnection
          (TcpConnection *this,EventLoop *loop,string *connection_name,int fd,InetAddress *address)

{
  Channel *this_00;
  _Rb_tree_header *p_Var1;
  _Bind<void_(higan::TcpConnection::*(higan::TcpConnection_*))()> local_98;
  string *local_80;
  ChannelCallback local_58;
  
  (this->super_enable_shared_from_this<higan::TcpConnection>)._M_weak_this.
  super___weak_ptr<higan::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_enable_shared_from_this<higan::TcpConnection>)._M_weak_this.
  super___weak_ptr<higan::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->loop_ = loop;
  local_80 = &this->connection_name_;
  std::__cxx11::string::string((string *)local_80,(string *)connection_name);
  Socket::Socket(&this->socket_,fd,address);
  this_00 = &this->channel_;
  Channel::Channel(this_00,this->loop_,connection_name,fd);
  Buffer::Buffer(&this->input_buffer_);
  Buffer::Buffer(&this->output_buffer_);
  this->connecting_ = false;
  this->call_send_over_callback_ = false;
  (this->context_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->context_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->context_map_)._M_t._M_impl.super__Rb_tree_header;
  *(undefined8 *)&(this->message_callback_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->message_callback_).super__Function_base._M_functor + 8) = 0;
  (this->message_callback_).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->message_callback_)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->error_callback_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->error_callback_).super__Function_base._M_functor + 8) = 0;
  (this->error_callback_).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->error_callback_)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->new_connection_callback_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->new_connection_callback_).super__Function_base._M_functor + 8) = 0;
  (this->new_connection_callback_).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->new_connection_callback_)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->write_over_callback_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->write_over_callback_).super__Function_base._M_functor + 8) = 0;
  (this->write_over_callback_).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->write_over_callback_)._M_invoker = (_Invoker_type)0x0;
  (this->context_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->context_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->context_map_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_98._M_f = (offset_in_TcpConnection_to_subr)OnReadable;
  local_98._8_8_ = 0;
  local_98._M_bound_args.super__Tuple_impl<0UL,_higan::TcpConnection_*>.
  super__Head_base<0UL,_higan::TcpConnection_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_higan::TcpConnection_*>)(_Tuple_impl<0UL,_higan::TcpConnection_*>)this;
  std::function<void()>::
  function<std::_Bind<void(higan::TcpConnection::*(higan::TcpConnection*))()>,void>
            ((function<void()> *)&local_58,&local_98);
  Channel::SetReadableCallback(this_00,&local_58);
  std::_Function_base::~_Function_base(&local_58.super__Function_base);
  local_98._M_f = (offset_in_TcpConnection_to_subr)OnWritable;
  local_98._8_8_ = 0;
  local_98._M_bound_args.super__Tuple_impl<0UL,_higan::TcpConnection_*>.
  super__Head_base<0UL,_higan::TcpConnection_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_higan::TcpConnection_*>)(_Tuple_impl<0UL,_higan::TcpConnection_*>)this;
  std::function<void()>::
  function<std::_Bind<void(higan::TcpConnection::*(higan::TcpConnection*))()>,void>
            ((function<void()> *)&local_58,&local_98);
  Channel::SetWritableCallback(this_00,&local_58);
  std::_Function_base::~_Function_base(&local_58.super__Function_base);
  local_98._M_f = (offset_in_TcpConnection_to_subr)OnError;
  local_98._8_8_ = 0;
  local_98._M_bound_args.super__Tuple_impl<0UL,_higan::TcpConnection_*>.
  super__Head_base<0UL,_higan::TcpConnection_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_higan::TcpConnection_*>)(_Tuple_impl<0UL,_higan::TcpConnection_*>)this;
  std::function<void()>::
  function<std::_Bind<void(higan::TcpConnection::*(higan::TcpConnection*))()>,void>
            ((function<void()> *)&local_58,&local_98);
  Channel::SetErrorCallback(this_00,&local_58);
  std::_Function_base::~_Function_base(&local_58.super__Function_base);
  return;
}

Assistant:

TcpConnection::TcpConnection(EventLoop* loop, const std::string& connection_name, int fd, const InetAddress& address):
		loop_(loop),
		connection_name_(connection_name),
		socket_(fd, address),
		channel_(loop_, connection_name, fd),
		connecting_(false),
		call_send_over_callback_(false)
{
	channel_.SetReadableCallback(std::bind(&TcpConnection::OnReadable, this));
	channel_.SetWritableCallback(std::bind(&TcpConnection::OnWritable, this));
	channel_.SetErrorCallback(std::bind(&TcpConnection::OnError, this));

}